

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Dist::renderStereo(V2Dist *this,StereoSample *dest,StereoSample *src,int nsamples)

{
  int local_28;
  int i;
  int nsamples_local;
  StereoSample *src_local;
  StereoSample *dest_local;
  V2Dist *this_local;
  
  if (this->mode == 4) {
    for (local_28 = 0; local_28 < nsamples; local_28 = local_28 + 1) {
      decimator_tick(this,src[local_28].field_0.l,*(float *)((long)src + (long)local_28 * 8 + 4));
      dest[local_28].field_0.l = this->dvall;
      *(float *)((long)dest + (long)local_28 * 8 + 4) = this->dvalr;
    }
  }
  else if (this->mode - 5U < 5) {
    V2Flt::render(&this->fltl,dest->ch,src->ch,nsamples,2);
    V2Flt::render(&this->fltr,&(dest->field_0).r,&(src->field_0).r,nsamples,2);
  }
  else {
    renderMono(this,dest->ch,src->ch,nsamples << 1);
  }
  return;
}

Assistant:

void renderStereo(StereoSample *dest, const StereoSample *src, int nsamples)
    {
        // @@@BUG this matches the original V2 code, but frankly I have my doubts
        // that always running the Moog filters in Mono mode is intentional...
        switch (mode)
        {
        case DECIMATOR:
            COVER("DIST stereo decimator");
            for (int i = 0; i < nsamples; i++)
            {
                decimator_tick(src[i].l, src[i].r);
                dest[i].l = dvall;
                dest[i].r = dvalr;
            }
            break;

        case FLT_LOW:
        case FLT_BAND:
        case FLT_HIGH:
        case FLT_NOTCH:
        case FLT_ALL:
            COVER("DIST stereo filter");
            fltl.render(&dest[0].l, &src[0].l, nsamples, 2);
            fltr.render(&dest[0].r, &src[0].r, nsamples, 2);
            break;

        default:
            // everything else we presume to be stateless and just pass through the
            // mono version.
            renderMono(&dest[0].l, &src[0].l, nsamples*2);
        }

        DEBUG_PLOT_STEREO(this, dest, nsamples);
    }